

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Def.cpp
# Opt level: O0

Def * __thiscall hdc::Def::getName_abi_cxx11_(Def *this)

{
  string *psVar1;
  long in_RSI;
  Def *this_local;
  
  psVar1 = Token::getLexem_abi_cxx11_((Token *)(in_RSI + 0x18));
  std::__cxx11::string::string((string *)this,(string *)psVar1);
  return this;
}

Assistant:

std::string Def::getName() {
    return name.getLexem();
}